

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,string *filename)

{
  bool bVar1;
  string *in_base;
  char *filename_00;
  cmMessenger *messenger;
  undefined1 local_98 [8];
  cmListFile listFile;
  undefined1 local_50 [8];
  ListFileScope scope;
  string filenametoread;
  string *filename_local;
  cmMakefile *this_local;
  
  in_base = GetCurrentSourceDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath((string *)&scope.ReportError,filename,in_base);
  ListFileScope::ListFileScope((ListFileScope *)local_50,this,(string *)&scope.ReportError);
  cmListFile::cmListFile((cmListFile *)local_98);
  filename_00 = (char *)std::__cxx11::string::c_str();
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile((cmListFile *)local_98,filename_00,messenger,&this->Backtrace);
  if (bVar1) {
    ReadListFile(this,(cmListFile *)local_98,(string *)&scope.ReportError);
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (bVar1) {
      ListFileScope::Quiet((ListFileScope *)local_50);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  cmListFile::~cmListFile((cmListFile *)local_98);
  ListFileScope::~ListFileScope((ListFileScope *)local_50);
  std::__cxx11::string::~string((string *)&scope.ReportError);
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::ReadListFile(const std::string& filename)
{
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->ReadListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }
  return true;
}